

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O3

bool __thiscall wasm::Type::isFunction(Type *this)

{
  int iVar1;
  HeapType HVar2;
  bool bVar3;
  
  if ((this->id & 1) == 0 && 6 < this->id) {
    HVar2 = getHeapType(this);
    bVar3 = true;
    if (0x7c < HVar2.id || ((uint)HVar2.id & 0x7b) != 0x10) {
      iVar1 = wasm::HeapType::getKind();
      bVar3 = iVar1 == 1;
    }
    return bVar3;
  }
  return false;
}

Assistant:

constexpr bool isBasic() const { return id <= _last_basic_type; }